

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

IndirOpnd * __thiscall
Lowerer::GetArgsIndirOpndForInlinee(Lowerer *this,Instr *ldElem,Opnd *valueOpnd)

{
  code *pcVar1;
  bool bVar2;
  BYTE scale;
  undefined4 *puVar3;
  SymOpnd *pSVar4;
  StackSym *stackSym;
  RegOpnd *dst;
  IntConstOpnd *pIVar5;
  long lVar6;
  RegOpnd *indexOpnd;
  int32 iStack_88;
  BYTE indirScale;
  IntConstType offset;
  AutoReuseOpnd autoReuseBaseOpnd;
  RegOpnd *baseOpnd;
  AutoReuseOpnd autoReuseFirstArg;
  SymOpnd *firstArg;
  StackSym *firstRealArgStackSym;
  IndirOpnd *argIndirOpnd;
  Opnd *valueOpnd_local;
  Instr *ldElem_local;
  Lowerer *this_local;
  
  bVar2 = Func::IsInlinee(ldElem->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5637,"(ldElem->m_func->IsInlinee())","ldElem->m_func->IsInlinee()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = Func::GetInlineeArgvSlotOpnd(ldElem->m_func);
  stackSym = Sym::AsStackSym(pSVar4->m_sym);
  Func::SetArgOffset(this->m_func,stackSym,stackSym->m_offset + 8);
  autoReuseFirstArg._16_8_ = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,ldElem->m_func);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&baseOpnd,(Opnd *)autoReuseFirstArg._16_8_,this->m_func,true);
  dst = IR::RegOpnd::New(TyInt64,ldElem->m_func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&offset,&dst->super_Opnd,this->m_func,true);
  InsertLea(dst,(Opnd *)autoReuseFirstArg._16_8_,ldElem);
  bVar2 = IR::Opnd::IsIntConstOpnd(valueOpnd);
  if (bVar2) {
    pIVar5 = IR::Opnd::AsIntConstOpnd(valueOpnd);
    lVar6 = IR::EncodableOpnd<long>::GetValue(&pIVar5->super_EncodableOpnd<long>);
    iStack_88 = (int32)(lVar6 << 3);
    firstRealArgStackSym =
         (StackSym *)IR::IndirOpnd::New(dst,iStack_88,TyInt64,ldElem->m_func,false);
  }
  else {
    bVar2 = IR::Opnd::IsRegOpnd(valueOpnd);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x564c,"(valueOpnd->IsRegOpnd())","valueOpnd->IsRegOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    scale = LowererMD::GetDefaultIndirScale();
    indexOpnd = IR::Opnd::AsRegOpnd(valueOpnd);
    firstRealArgStackSym =
         (StackSym *)IR::IndirOpnd::New(dst,indexOpnd,scale,TyInt64,ldElem->m_func);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&offset);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&baseOpnd);
  return (IndirOpnd *)firstRealArgStackSym;
}

Assistant:

IR::IndirOpnd*
Lowerer::GetArgsIndirOpndForInlinee(IR::Instr* ldElem, IR::Opnd* valueOpnd)
{
    Assert(ldElem->m_func->IsInlinee());
    IR::IndirOpnd* argIndirOpnd = nullptr;

    // Address of argument after 'this'
    const auto firstRealArgStackSym = ldElem->m_func->GetInlineeArgvSlotOpnd()->m_sym->AsStackSym();
    this->m_func->SetArgOffset(firstRealArgStackSym, firstRealArgStackSym->m_offset + MachPtr); //Start after this pointer
    IR::SymOpnd *firstArg = IR::SymOpnd::New(firstRealArgStackSym, TyMachPtr, ldElem->m_func);
    const IR::AutoReuseOpnd autoReuseFirstArg(firstArg, m_func);

    IR::RegOpnd *const baseOpnd = IR::RegOpnd::New(TyMachReg, ldElem->m_func);
    const IR::AutoReuseOpnd autoReuseBaseOpnd(baseOpnd, m_func);
    InsertLea(baseOpnd, firstArg, ldElem);

    if (valueOpnd->IsIntConstOpnd())
    {
        IntConstType offset = valueOpnd->AsIntConstOpnd()->GetValue() * MachPtr;
        // TODO: Assert(Math::FitsInDWord(offset));
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, ldElem->m_func);
    }
    else
    {
        Assert(valueOpnd->IsRegOpnd());
        const BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, valueOpnd->AsRegOpnd(), indirScale, TyMachReg, ldElem->m_func);
    }
    return argIndirOpnd;
}